

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunkedAllocator.c
# Opt level: O3

sysbvm_chunkedAllocatorChunk_t *
sysbvm_chunkedAllocator_ensureChunkWithRequiredCapacity
          (sysbvm_chunkedAllocator_t *allocator,size_t size,size_t alignment)

{
  _Bool _Var1;
  sysbvm_chunkedAllocatorChunk_t *psVar2;
  void *pvVar3;
  sysbvm_chunkedAllocatorChunk_s *psVar4;
  byte bVar5;
  sysbvm_chunkedAllocatorChunk_t *newChunkWriteableMapping;
  sysbvm_chunkedAllocatorChunk_t *newChunkExecutableMapping;
  sysbvm_chunkedAllocatorChunk_t *local_28;
  sysbvm_chunkedAllocatorChunk_s *local_20;
  
  psVar2 = allocator->currentChunk;
  if (psVar2 != (sysbvm_chunkedAllocatorChunk_t *)0x0) {
    do {
      if (((size + alignment) - 1 & -alignment) <=
          psVar2->capacity - (psVar2->size + (alignment - 1) & -alignment)) {
        return psVar2;
      }
      psVar2 = psVar2->next;
      allocator->currentChunk = psVar2;
    } while (psVar2 != (sysbvm_chunkedAllocatorChunk_s *)0x0);
  }
  local_28 = (sysbvm_chunkedAllocatorChunk_t *)0x0;
  local_20 = (sysbvm_chunkedAllocatorChunk_s *)0x0;
  if (allocator->requiresExecutableMapping == true) {
    _Var1 = sysbvm_virtualMemory_hasSupportForRWXMapping();
    if (_Var1) {
      local_28 = (sysbvm_chunkedAllocatorChunk_t *)
                 sysbvm_virtualMemory_allocateSystemMemory(allocator->chunkSize);
      local_28->capacity = 0;
      local_28->size = 0;
      local_28->dualMappingHandle = (void *)0x0;
      local_28->reserved = (void *)0x0;
      local_28->writeableMapping = (sysbvm_chunkedAllocatorChunk_s *)0x0;
      local_28->executableMapping = (sysbvm_chunkedAllocatorChunk_s *)0x0;
      local_28->previous = (sysbvm_chunkedAllocatorChunk_s *)0x0;
      local_28->next = (sysbvm_chunkedAllocatorChunk_s *)0x0;
      psVar4 = local_28;
      local_20 = local_28;
    }
    else {
      pvVar3 = sysbvm_virtualMemory_allocateSystemMemoryWithDualMapping
                         (allocator->chunkSize,&local_28,&local_20);
      local_28->dualMappingHandle = (void *)0x0;
      local_28->reserved = (void *)0x0;
      local_28->previous = (sysbvm_chunkedAllocatorChunk_s *)0x0;
      local_28->next = (sysbvm_chunkedAllocatorChunk_s *)0x0;
      local_28->writeableMapping = (sysbvm_chunkedAllocatorChunk_s *)0x0;
      local_28->executableMapping = (sysbvm_chunkedAllocatorChunk_s *)0x0;
      local_28->capacity = 0;
      local_28->size = 0;
      local_28->dualMappingHandle = pvVar3;
      psVar4 = local_20;
    }
  }
  else {
    local_28 = (sysbvm_chunkedAllocatorChunk_t *)
               sysbvm_virtualMemory_allocateSystemMemory(allocator->chunkSize);
    local_28->previous = (sysbvm_chunkedAllocatorChunk_s *)0x0;
    local_28->next = (sysbvm_chunkedAllocatorChunk_s *)0x0;
    local_28->writeableMapping = (sysbvm_chunkedAllocatorChunk_s *)0x0;
    local_28->executableMapping = (sysbvm_chunkedAllocatorChunk_s *)0x0;
    local_28->dualMappingHandle = (void *)0x0;
    local_28->reserved = (void *)0x0;
    local_28->capacity = 0;
    local_28->size = 0;
    psVar4 = (sysbvm_chunkedAllocatorChunk_s *)0x0;
  }
  local_28->capacity = allocator->chunkSize - 0x40;
  local_28->writeableMapping = local_28;
  local_28->executableMapping = psVar4;
  if (allocator->firstChunk == (sysbvm_chunkedAllocatorChunk_t *)0x0) {
    allocator->firstChunk = local_28;
  }
  psVar4 = allocator->lastChunk;
  if (psVar4 != (sysbvm_chunkedAllocatorChunk_s *)0x0) {
    bVar5 = allocator->requiresExecutableMapping;
    if ((_Bool)bVar5 == true) {
      _Var1 = sysbvm_virtualMemory_lockCodePagesForWriting
                        (psVar4->writeableMapping,psVar4->executableMapping,0x40);
      if (!_Var1) {
        abort();
      }
      psVar4 = allocator->lastChunk;
      bVar5 = allocator->requiresExecutableMapping;
    }
    psVar4->next = local_28;
    local_28->previous = psVar4;
    if ((bVar5 & 1) != 0) {
      sysbvm_virtualMemory_unlockCodePagesForExecution
                (psVar4->writeableMapping,psVar4->executableMapping,0x40);
    }
  }
  allocator->lastChunk = local_28;
  allocator->currentChunk = local_28;
  return local_28;
}

Assistant:

static sysbvm_chunkedAllocatorChunk_t *sysbvm_chunkedAllocator_ensureChunkWithRequiredCapacity(sysbvm_chunkedAllocator_t *allocator, size_t size, size_t alignment)
{
    sysbvm_chunkedAllocatorChunk_t **currentChunk = &allocator->currentChunk;

    // Advance the current chunk.
    size_t requiredAlignedSize = sysbvm_chunkedAllocator_sizeAlignedTo(size, alignment);
    while(*currentChunk && ((*currentChunk)->capacity - sysbvm_chunkedAllocator_sizeAlignedTo((*currentChunk)->size, alignment)) < requiredAlignedSize)
        *currentChunk = (*currentChunk)->next;

    // Create a new chunk if needed
    if(*currentChunk == NULL)
    {
        sysbvm_chunkedAllocatorChunk_t *newChunkWriteableMapping = NULL;
        sysbvm_chunkedAllocatorChunk_t *newChunkExecutableMapping = NULL;

        if(allocator->requiresExecutableMapping)
        {
            if(sysbvm_virtualMemory_hasSupportForRWXMapping())
            {
                newChunkExecutableMapping = newChunkWriteableMapping = (sysbvm_chunkedAllocatorChunk_t*)sysbvm_virtualMemory_allocateSystemMemory(allocator->chunkSize);
                memset(newChunkWriteableMapping, 0, sizeof(sysbvm_chunkedAllocatorChunk_t));
            }
            else
            {
                void *handle = sysbvm_virtualMemory_allocateSystemMemoryWithDualMapping(allocator->chunkSize, (void**)&newChunkWriteableMapping, (void**)&newChunkExecutableMapping);
                memset(newChunkWriteableMapping, 0, sizeof(sysbvm_chunkedAllocatorChunk_t));
                newChunkWriteableMapping->dualMappingHandle = handle;
            }
        }
        else
        {
            newChunkWriteableMapping = (sysbvm_chunkedAllocatorChunk_t*)sysbvm_virtualMemory_allocateSystemMemory(allocator->chunkSize);
            memset(newChunkWriteableMapping, 0, sizeof(sysbvm_chunkedAllocatorChunk_t));
        }
        
        newChunkWriteableMapping->capacity = allocator->chunkSize - sizeof(sysbvm_chunkedAllocatorChunk_t);
        newChunkWriteableMapping->writeableMapping = newChunkWriteableMapping;
        newChunkWriteableMapping->executableMapping = newChunkExecutableMapping;

        if(!allocator->firstChunk)
            allocator->firstChunk = newChunkWriteableMapping;

        if(allocator->lastChunk)
        {
            if(allocator->requiresExecutableMapping &&
                !sysbvm_virtualMemory_lockCodePagesForWriting(allocator->lastChunk->writeableMapping, allocator->lastChunk->executableMapping, sizeof(sysbvm_chunkedAllocatorChunk_t)))
                abort();

            allocator->lastChunk->next = newChunkWriteableMapping;
            newChunkWriteableMapping->previous = allocator->lastChunk;

            if(allocator->requiresExecutableMapping)
                sysbvm_virtualMemory_unlockCodePagesForExecution(allocator->lastChunk->writeableMapping, allocator->lastChunk->executableMapping, sizeof(sysbvm_chunkedAllocatorChunk_t));
        }
        allocator->lastChunk = newChunkWriteableMapping;

        *currentChunk = newChunkWriteableMapping;
    }

    return *currentChunk;

}